

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

Vector3d * __thiscall Util::EGM96Grav::GetGravAccel(EGM96Grav *this,Vector3d *pos,double JD_UTC)

{
  initializer_list<int> __l;
  Scalar SVar1;
  Scalar SVar2;
  Scalar SVar3;
  StorageBaseType *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Matrix<double,_3,_1,_0,_3,_1> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  double *in_RSI;
  Vector3d *in_RDI;
  double dVar7;
  double dVar8;
  type tVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  iterator piVar15;
  vector<int,_std::allocator<int>_> *this_01;
  double dVar16;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> PVar17;
  Vector3d accel_central;
  Matrix3d Rsp2cart;
  vector<int,_std::allocator<int>_> order;
  Vector3d angles;
  double Plm_plus;
  double Plm;
  double S;
  double C;
  double powR;
  double mm;
  double ll;
  double lamb;
  double phi;
  Vector3d pos_ecef;
  Matrix3d R_ecef2eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  double nr_ij;
  double pUplamb;
  double pUpphi;
  double pUpr;
  double mu;
  double R;
  double r3;
  double r2;
  double r;
  Vector3d accel;
  Vector3d *accel_eci;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_000005c0;
  MatrixXd *in_stack_000005c8;
  MatrixXd *in_stack_000005d0;
  double in_stack_000005d8;
  EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_fffffffffffffb08;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffb10;
  allocator_type *in_stack_fffffffffffffb18;
  value_type *in_stack_fffffffffffffb20;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *this_02;
  size_type in_stack_fffffffffffffb28;
  Scalar *z;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffb30;
  Index in_stack_fffffffffffffb38;
  allocator_type *__a;
  StorageBaseType *matrix;
  vector<int,_std::allocator<int>_> *__x;
  Vector3d *angles_00;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  local_215;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 *local_208;
  undefined8 local_200;
  undefined8 local_1e0;
  double local_1d8;
  double local_1b8;
  double local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  non_const_type local_170;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_168;
  double local_80;
  allocator_type *local_78;
  Scalar *local_70;
  StorageBaseType *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  angles_00 = in_RDI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x132480);
  local_40 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_fffffffffffffb08);
  local_48 = pow(local_40,2.0);
  local_50 = pow(local_40,3.0);
  local_58 = in_RSI[1];
  local_60 = *in_RSI;
  local_68 = (StorageBaseType *)0x0;
  local_70 = (Scalar *)0x0;
  local_78 = (allocator_type *)0x0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  dVar7 = pow(*pSVar5,2.0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  dVar8 = pow(*pSVar5,2.0);
  local_80 = sqrt(dVar7 + dVar8);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity
            (in_stack_fffffffffffffb38,(Index)in_stack_fffffffffffffb30);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffb10,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffb08);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x1325e1);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
           in_stack_fffffffffffffb18);
  std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x132612);
  ECEF2ECI(in_stack_000005d8,in_stack_000005d0,in_stack_000005c8,in_stack_000005c0);
  local_170 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffffb08);
  local_168 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                         in_stack_fffffffffffffb10,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_fffffffffffffb08);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  local_178 = asin(*pSVar5 / local_40);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  dVar7 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  local_180 = atan2(dVar7,*pSVar5);
  for (local_188 = 2.0; local_188 < 21.0; local_188 = local_188 + 1.0) {
    for (local_190 = 0.0; local_190 < local_188 + 1.0; local_190 = local_190 + 1.0) {
      local_198 = pow(local_58 / local_40,local_188);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08,0x132827);
      local_1a0 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08,0x13286f);
      local_1a8 = *pSVar6;
      dVar7 = pow(-1.0,local_190);
      sin(local_178);
      tVar9 = boost::math::legendre_p<double>
                        ((int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                         (int)in_stack_fffffffffffffb10,(double)in_stack_fffffffffffffb08);
      local_1b0 = dVar7 * tVar9;
      dVar7 = pow(-1.0,local_190);
      sin(local_178);
      tVar9 = boost::math::legendre_p<double>
                        ((int)((ulong)in_stack_fffffffffffffb10 >> 0x20),
                         (int)in_stack_fffffffffffffb10,(double)in_stack_fffffffffffffb08);
      SVar2 = local_1a0;
      local_1b8 = dVar7 * tVar9;
      dVar7 = local_198 * (local_188 + 1.0) * local_1b0;
      dVar10 = cos(local_190 * local_180);
      SVar1 = local_1a8;
      dVar11 = sin(local_190 * local_180);
      dVar8 = local_198;
      local_68 = (StorageBaseType *)(dVar7 * (SVar2 * dVar10 + SVar1 * dVar11) + (double)local_68);
      dVar10 = -local_188;
      dVar11 = sin(local_178);
      dVar12 = cos(local_178);
      dVar7 = local_1b0;
      dVar13 = local_188 + local_190;
      dVar14 = cos(local_178);
      SVar3 = local_1a0;
      dVar16 = dVar13 * (1.0 / dVar14) * local_1b8;
      dVar13 = cos(local_190 * local_180);
      SVar1 = local_1a8;
      dVar14 = sin(local_190 * local_180);
      SVar2 = local_1a8;
      local_70 = (Scalar *)
                 (dVar8 * (dVar10 * dVar11 * (1.0 / dVar12) * dVar7 + dVar16) *
                  (SVar3 * dVar13 + SVar1 * dVar14) + (double)local_70);
      dVar7 = local_198 * local_190 * local_1b0;
      dVar8 = cos(local_190 * local_180);
      SVar1 = local_1a0;
      dVar10 = sin(local_190 * local_180);
      local_78 = (allocator_type *)(dVar7 * (SVar2 * dVar8 + -(SVar1 * dVar10)) + (double)local_78);
    }
  }
  piVar15 = (iterator)((ulong)local_60 ^ 0x8000000000000000);
  __x = (vector<int,_std::allocator<int>_> *)0x4000000000000000;
  dVar7 = pow(local_40,2.0);
  this_01 = (vector<int,_std::allocator<int>_> *)((double)local_70 * local_60);
  matrix = local_68;
  local_68 = (StorageBaseType *)((double)local_68 * ((double)piVar15 / dVar7));
  dVar7 = pow(local_40,(double)__x);
  local_70 = (Scalar *)((double)this_01 / dVar7);
  dVar7 = (double)local_78 * local_60;
  dVar8 = pow(local_40,(double)__x);
  dVar10 = cos(local_178);
  pSVar4 = local_68;
  local_78 = (allocator_type *)((dVar7 / dVar8) / dVar10);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  *pSVar5 = (Scalar)pSVar4;
  __a = local_78;
  this_00 = (Matrix<double,_3,_1,_0,_3,_1> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  (this_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       = (double)__a;
  z = local_70;
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                    (in_stack_fffffffffffffb10,(Index)in_stack_fffffffffffffb08);
  *(Scalar **)other = z;
  local_1d8 = -local_180;
  local_1e0 = 0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(this_00,(Scalar *)__a,(Scalar *)other,z);
  local_214 = 2;
  local_210 = 3;
  local_20c = 1;
  local_208 = &local_214;
  local_200 = 3;
  this_02 = &local_215;
  std::allocator<int>::allocator((allocator<int> *)0x133000);
  __l._M_len = (size_type)matrix;
  __l._M_array = piVar15;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_00,__l,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x133031);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffb10,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffb08);
  std::vector<int,_std::allocator<int>_>::vector(this_01,__x);
  Angle2RotM(angles_00,(vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
  Eigen::operator*((double *)__x,matrix);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffb10,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffb08);
  PVar17 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffb10
                      ,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       in_stack_fffffffffffffb08);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
  operator*(this_02,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar17.m_lhs);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator+((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)__a,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)PVar17.m_rhs,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffb08);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)this_02);
  return angles_00;
}

Assistant:

Eigen::Vector3d EGM96Grav::GetGravAccel(Eigen::Vector3d pos, double JD_UTC){

		//make short namespace
		namespace bm = boost::math;

		//initialize output
		Eigen::Vector3d accel;

		//locals
		double r = pos.norm();
		double r2 = pow(r,2.0);
		double r3 = pow(r,3.0);
		double R = this->Rearth_;
		double mu = this->mu_;
		double pUpr = 0.0; //partial potential wrt radius
		double pUpphi = 0.0; //partial potential wrt satellite latitude
		double pUplamb = 0.0; //partial potential wrt satellite latitude
		double nr_ij = sqrt(pow(pos[0],2.0) + pow(pos[1],2.0));

		//matrix rotating from ECEF2ECI
		std::vector<Eigen::Matrix3d> matvec(4, Eigen::Matrix3d::Identity(3,3));
		Eigen::Matrix3d R_ecef2eci = ECEF2ECI(JD_UTC, this->nut80ptr_, this->iau1980ptr_, &matvec);

		//ecef position
		Eigen::Vector3d pos_ecef = R_ecef2eci.transpose()*pos;

		// std::cout << "pos_ecef: \n" << pos_ecef << "\n";

		//lat and long
		double phi = asin(pos_ecef[2]/r);
		double lamb = atan2(pos_ecef[1],pos_ecef[0]);

		// std::cout << " JD_UTC: " << JD_UTC << " r: " << r << " phi: " << phi << " lamb: " << lamb << "\n";

		//fixed order gravity model but have capability to do more
		for (double ll = 2; ll < 21; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

		// for (double ll = 2; ll < 3; ++ll) {

		// 	for (double mm = 0; mm < 1; ++mm) {

				//locals
				double powR = pow(R/r,ll);
				double C = this->C_( (int) ll, (int) mm);
				double S = this->S_( (int) ll, (int) mm);
				double Plm = pow(-1.0,mm)*bm::legendre_p( (int) ll, (int) mm, sin(phi)); //pow(-1,m) to account for cordon shortley
				// double Plm_plus = pow(-1.0,mm+1.0)*bm::legendre_p( (int) ll, ((int) mm) + 1, sin(phi));
				double Plm_plus = pow(-1.0,mm)*bm::legendre_p( (int) ll - 1, (int) mm, sin(phi));

				// std::cout << "l: " << ll << " m: " << mm << "\n";

				pUpr += powR*(ll + 1.0)*Plm*(C*cos(mm*lamb) + S*sin(mm*lamb));
				// pUpphi += powR*(Plm_plus - mm*tan(phi)*Plm) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUpphi += powR*(-ll*sin(phi)*(1/cos(phi))*Plm + (ll+mm)*(1/cos(phi))*Plm_plus) * (C*cos(mm*lamb) + S*sin(mm*lamb));
				pUplamb += powR*mm*Plm*(S*cos(mm*lamb) - C*sin(mm*lamb));

			}

		}

		//additional factors outside of sum for partials
		// pUpr = pUpr*(-mu/pow(r,2.0));
		// pUpphi = pUpphi*mu/r;
		// pUplamb = pUplamb*mu/r;
		pUpr = pUpr*(-mu/pow(r,2.0));
		pUpphi = pUpphi*mu/pow(r,2.0);
		pUplamb = pUplamb*mu/pow(r,2.0)/cos(phi);

		// pUpphi = -7.0036240305764034*pow(10.0,-8.0);

		// std::cout << "pUpr: " << pUpr << "\n" << "pUpphi: " << pUpphi << "\n" << "pUplamb: " << pUplamb << "\n";

		//calculate components of acceleration
		// accel[0] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[0] - pUplamb*pos[1]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[0]/r3;
		// accel[1] = (pUpr/r - pos[2]*pUpphi/(r2*nr_ij))*pos[1] + pUplamb*pos[0]/(pow(pos[0],2.0) + pow(pos[1],2.0)) - mu*pos[1]/r3;
		// accel[2] = pUpr*pos[2]/r + nr_ij*pUpphi/r2 - mu*pos[2]/r3;
		accel[0] = pUpr;
		accel[1] = pUplamb;
		accel[2] = pUpphi;

		//rotation from spherical to cartesian
		Eigen::Vector3d angles = {phi, -lamb, 0.0};
		std::vector<int> order = {2,3,1};
		Eigen::Matrix3d Rsp2cart = Angle2RotM(angles, order);

		//we also need the central acceleration in ECI
		Eigen::Vector3d accel_central = -(mu/r3)*pos;

		//rotate accel into ECI
		Eigen::Vector3d accel_eci = R_ecef2eci*Rsp2cart*accel + accel_central;

		// std::cout << "\n" << "accel ecef (no central): \n" << Rsp2cart*accel;
		// std::cout << "\n" << "accel eci (with central): \n" << accel_eci;

		// exit(0);

		return accel_eci;

	}